

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsview.cpp
# Opt level: O3

void __thiscall QGraphicsView::setDragMode(QGraphicsView *this,DragMode mode)

{
  QGraphicsViewPrivate *this_00;
  QWidget *pQVar1;
  long in_FS_OFFSET;
  QCursor QStack_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QGraphicsViewPrivate **)(this + 8);
  if (this_00->dragMode != mode) {
    QGraphicsViewPrivate::clearRubberBand(this_00);
    if (this_00->dragMode == ScrollHandDrag) {
      pQVar1 = QAbstractScrollArea::viewport((QAbstractScrollArea *)this);
      QWidget::unsetCursor(pQVar1);
      if ((mode == NoDrag) && (this_00->dragMode == ScrollHandDrag)) {
        if ((*(uint *)&this_00->field_0x300 >> 9 & 1) != 0) {
          *(uint *)&this_00->field_0x300 = *(uint *)&this_00->field_0x300 & 0xfffffdff;
        }
        this_00->dragMode = NoDrag;
        goto LAB_00631012;
      }
    }
    this_00->dragMode = mode;
    if (mode == ScrollHandDrag) {
      this_00->hasStoredOriginalCursor = false;
      pQVar1 = QAbstractScrollArea::viewport((QAbstractScrollArea *)this);
      QCursor::QCursor(&QStack_28,OpenHandCursor);
      QWidget::setCursor(pQVar1,&QStack_28);
      QCursor::~QCursor(&QStack_28);
    }
  }
LAB_00631012:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGraphicsView::setDragMode(DragMode mode)
{
    Q_D(QGraphicsView);
    if (d->dragMode == mode)
        return;

#if QT_CONFIG(rubberband)
    d->clearRubberBand();
#endif

#ifndef QT_NO_CURSOR
    if (d->dragMode == ScrollHandDrag)
        viewport()->unsetCursor();
#endif

    // If dragMode is unset while dragging, e.g. via a keyEvent, we
    // don't unset the handScrolling state. When enabling scrolling
    // again the mouseMoveEvent will automatically start scrolling,
    // without a mousePress
    if (d->dragMode == ScrollHandDrag && mode == NoDrag && d->handScrolling)
        d->handScrolling = false;

    d->dragMode = mode;

#ifndef QT_NO_CURSOR
    if (d->dragMode == ScrollHandDrag) {
        // Forget the stored viewport cursor when we enter scroll hand drag mode.
        d->hasStoredOriginalCursor = false;
        viewport()->setCursor(Qt::OpenHandCursor);
    }
#endif
}